

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

void __thiscall QLibraryPrivate::~QLibraryPrivate(QLibraryPrivate *this)

{
  QMutex *in_RDI;
  
  QString::~QString((QString *)0x8c2373);
  QString::~QString((QString *)0x8c2381);
  QPluginParsedMetaData::~QPluginParsedMetaData((QPluginParsedMetaData *)0x8c238f);
  QPointer<QObject>::~QPointer((QPointer<QObject> *)0x8c239d);
  QMutex::~QMutex(in_RDI);
  QString::~QString((QString *)0x8c23b9);
  QString::~QString((QString *)0x8c23c3);
  return;
}

Assistant:

QLibraryPrivate::~QLibraryPrivate()
{
}